

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O3

int picnic_impl_sign(picnic_instance_t *pp,picnic_context_t *context,uint8_t *sig,size_t *siglen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  undefined2 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  proof_round_t *ppVar14;
  undefined1 *__n;
  picnic_context_t *ppVar15;
  BitSequence *pBVar16;
  view_t *pvVar17;
  view_t *views;
  undefined1 auVar18 [64];
  bool bVar19;
  int iVar20;
  recorded_state_t *state;
  void *pvVar21;
  long lVar22;
  BitSequence *pBVar23;
  ulong uVar24;
  ulong uVar25;
  byte bVar26;
  undefined1 *puVar27;
  bool bVar28;
  uint j_8;
  kdf_shake_x4_t *kdf;
  uint8_t *puVar29;
  mzd_local_t (*pamVar30) [1];
  Keccak_HashInstance *instance;
  byte *pbVar31;
  long lVar32;
  Keccak_HashInstancetimes4 *instance_00;
  uint j_7;
  kdf_shake_t *kdf_00;
  ulong uVar33;
  uint uVar34;
  uint j;
  uint uVar35;
  uint j_1;
  BitLength databitlen;
  uint8_t *puVar36;
  uint16_t round_numbers [4];
  in_out_shares_t in_out_shares;
  uint16_t data_le;
  uint8_t public_key [32];
  uint8_t *local_d18;
  undefined1 local_d10 [16];
  uint8_t *puStack_d00;
  uint8_t *puStack_cf8;
  proof_round_t *local_ce8;
  undefined1 *local_ce0;
  ushort local_cd2;
  undefined1 *local_cd0;
  picnic_context_t *local_cc8;
  BitSequence *local_cc0;
  BitSequence *local_cb8;
  uint local_cb0;
  uint local_cac;
  ulong local_ca8;
  ulong local_ca0;
  undefined8 local_c98;
  mzd_local_t *local_c90;
  view_t *local_c88;
  view_t *local_c80;
  ulong local_c78;
  uint8_t *local_c70;
  ulong local_c68;
  recorded_state_t *local_c60;
  ulong local_c58;
  uint local_c50;
  int local_c4c;
  uint8_t *local_c48;
  size_t *local_c40;
  ulong local_c38;
  BitSequence *local_c30;
  zkbpp_lowmc_implementation_f local_c28;
  undefined1 local_c20 [16];
  undefined1 auStack_c10 [16];
  undefined1 local_c00 [16];
  undefined1 auStack_bf0 [16];
  undefined1 local_be0 [56];
  long local_ba8;
  ulong local_ba0;
  ulong local_b98;
  ulong local_b90;
  long local_b88;
  undefined1 local_b80 [16];
  uint8_t *puStack_b70;
  uint8_t *puStack_b68;
  undefined1 auStack_b60 [32];
  undefined1 local_b40 [64];
  undefined1 local_b00 [64];
  undefined1 local_ac0 [96];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [824];
  Keccak_HashInstancetimes4 local_6e8 [2];
  
  uVar4 = (pp->lowmc).n;
  local_cb0 = (uint)pp->num_rounds;
  local_ca0 = (ulong)pp->input_output_size;
  local_ca8 = (ulong)pp->view_size;
  local_c48 = sig;
  local_c40 = siglen;
  local_c28 = get_zkbpp_lowmc_implementation(&pp->lowmc);
  state = (recorded_state_t *)aligned_alloc(0x20,(ulong)(pp->lowmc).r * 0x20 + 0x20);
  lowmc_record_state(&pp->lowmc,context->m_key,context->m_plaintext,state);
  local_a20[0] = '\0';
  local_a20[1] = '\0';
  local_a20[2] = '\0';
  local_a20[3] = '\0';
  local_a20[4] = '\0';
  local_a20[5] = '\0';
  local_a20[6] = '\0';
  local_a20[7] = '\0';
  local_a20[8] = '\0';
  local_a20[9] = '\0';
  local_a20[10] = '\0';
  local_a20[0xb] = '\0';
  local_a20[0xc] = '\0';
  local_a20[0xd] = '\0';
  local_a20[0xe] = '\0';
  local_a20[0xf] = '\0';
  local_a20[0x10] = '\0';
  local_a20[0x11] = '\0';
  local_a20[0x12] = '\0';
  local_a20[0x13] = '\0';
  local_a20[0x14] = '\0';
  local_a20[0x15] = '\0';
  local_a20[0x16] = '\0';
  local_a20[0x17] = '\0';
  local_a20[0x18] = '\0';
  local_a20[0x19] = '\0';
  local_a20[0x1a] = '\0';
  local_a20[0x1b] = '\0';
  local_a20[0x1c] = '\0';
  local_a20[0x1d] = '\0';
  local_a20[0x1e] = '\0';
  local_a20[0x1f] = '\0';
  mzd_to_char_array(local_a20,state[(pp->lowmc).r].state,(ulong)pp->input_output_size);
  iVar20 = picnic_timingsafe_bcmp(context->public_key,local_a20,(ulong)pp->input_output_size);
  if (iVar20 == 0) {
    uVar5 = pp->num_rounds;
    bVar26 = pp->digest_size;
    bVar1 = pp->seed_size;
    bVar2 = pp->input_output_size;
    uVar25 = (ulong)bVar2;
    bVar3 = pp->view_size;
    local_cd0 = (undefined1 *)(ulong)((int)local_ca8 + 7U & 0xfffffff8);
    local_cc8 = context;
    local_c90 = context->m_key;
    local_c60 = state;
    local_cb8 = (BitSequence *)calloc(1,(ulong)((uint)uVar5 * 0x90) + 0x28);
    local_ce0 = (undefined1 *)(ulong)uVar5;
    if (local_cb8 != (BitSequence *)0x0) {
      uVar34 = (uint)bVar3 + (uint)bVar2;
      uVar35 = bVar3 + 7 & 0xfffffff8;
      local_ce8 = (proof_round_t *)CONCAT71(local_ce8._1_7_,local_cc8->unruh);
      iVar20 = 0;
      if (local_cc8->unruh != false) {
        iVar20 = uVar34 * 3 + (uint)bVar2;
      }
      local_cc0 = (BitSequence *)(ulong)(uVar5 + 7 & 0xfffffff8);
      pvVar21 = calloc(1,(long)local_cc0 + 0x20U +
                         (ulong)((iVar20 + ((uint)bVar1 + (uint)bVar26 + (uint)bVar2 * 2 + uVar35) *
                                           3) * (uint)uVar5));
      *(void **)(local_cb8 + 0x20) = pvVar21;
      if (local_ce0 != (undefined1 *)0x0) {
        lVar22 = (long)pvVar21 + (long)local_cc0;
        pBVar23 = local_cb8 + 0x28;
        puVar27 = (undefined1 *)0x0;
        do {
          lVar32 = 0;
          do {
            *(long *)(pBVar23 + lVar32 * 8) = lVar22;
            lVar22 = lVar22 + (ulong)bVar1;
            lVar32 = lVar32 + 1;
          } while (lVar32 != 3);
          puVar27 = puVar27 + 1;
          pBVar23 = pBVar23 + 0x90;
        } while (puVar27 != local_ce0);
        pBVar23 = local_cb8 + 0x40;
        puVar27 = (undefined1 *)0x0;
        do {
          lVar32 = 0;
          do {
            *(long *)(pBVar23 + lVar32 * 8) = lVar22;
            lVar22 = lVar22 + (ulong)bVar26;
            lVar32 = lVar32 + 1;
          } while (lVar32 != 3);
          puVar27 = puVar27 + 1;
          pBVar23 = pBVar23 + 0x90;
        } while (puVar27 != local_ce0);
        pBVar23 = local_cb8 + 0x58;
        puVar27 = (undefined1 *)0x0;
        do {
          lVar32 = 0;
          do {
            *(long *)(pBVar23 + lVar32 * 8) = lVar22;
            lVar22 = lVar22 + uVar25;
            lVar32 = lVar32 + 1;
          } while (lVar32 != 3);
          puVar27 = puVar27 + 1;
          pBVar23 = pBVar23 + 0x90;
        } while (puVar27 != local_ce0);
        pBVar23 = local_cb8 + 0x70;
        puVar27 = (undefined1 *)0x0;
        do {
          lVar32 = 0;
          do {
            *(long *)(pBVar23 + lVar32 * 8) = lVar22;
            lVar22 = lVar22 + (ulong)uVar35;
            lVar32 = lVar32 + 1;
          } while (lVar32 != 3);
          puVar27 = puVar27 + 1;
          pBVar23 = pBVar23 + 0x90;
        } while (puVar27 != local_ce0);
        pBVar23 = local_cb8 + 0x88;
        puVar27 = (undefined1 *)0x0;
        do {
          lVar32 = 0;
          do {
            *(long *)(pBVar23 + lVar32 * 8) = lVar22;
            lVar22 = lVar22 + uVar25;
            lVar32 = lVar32 + 1;
          } while (lVar32 != 3);
          puVar27 = puVar27 + 1;
          pBVar23 = pBVar23 + 0x90;
        } while (puVar27 != local_ce0);
        if ((char)local_ce8 != '\0') {
          pBVar23 = local_cb8 + 0xa0;
          puVar27 = (undefined1 *)0x0;
          do {
            lVar32 = 0;
            do {
              *(long *)(pBVar23 + lVar32 * 8) = lVar22;
              lVar22 = lVar22 + (ulong)uVar34;
              lVar32 = lVar32 + 1;
            } while (lVar32 != 3);
            lVar22 = lVar22 + uVar25;
            puVar27 = puVar27 + 1;
            pBVar23 = pBVar23 + 0x90;
          } while (puVar27 != local_ce0);
        }
      }
    }
    pBVar23 = local_cb8;
    local_c38 = (ulong)(uint)((int)local_ca0 * 8);
    local_c80 = (view_t *)aligned_alloc(0x20,(ulong)(pp->lowmc).r * 0x60);
    local_cc0 = *(BitSequence **)(pBVar23 + 0x28);
    if (bVar26 == 0x20) {
      uVar35 = 0x540;
      uVar34 = 0x100;
    }
    else {
      uVar35 = 0x440;
      uVar34 = 0x200;
    }
    Keccak_HashInitialize((Keccak_HashInstance *)local_a20,uVar35,uVar34,0,'\x1f');
    ppVar15 = local_cc8;
    databitlen = (ulong)bVar2 << 3;
    local_cac = (int)local_c38 - (uint)uVar4;
    local_ce8 = (proof_round_t *)(local_cb8 + 0x28);
    Keccak_HashUpdate((Keccak_HashInstance *)local_a20,local_cc8->private_key,databitlen);
    Keccak_HashUpdate((Keccak_HashInstance *)local_a20,ppVar15->msg,ppVar15->msglen << 3);
    Keccak_HashUpdate((Keccak_HashInstance *)local_a20,ppVar15->public_key,databitlen);
    Keccak_HashUpdate((Keccak_HashInstance *)local_a20,ppVar15->plaintext,databitlen);
    local_b80._0_2_ = (pp->lowmc).n;
    Keccak_HashUpdate((Keccak_HashInstance *)local_a20,local_b80,0x10);
    uVar25 = 0;
    Keccak_HashFinal((Keccak_HashInstance *)local_a20,(BitSequence *)0x0);
    pBVar23 = local_cb8;
    Keccak_HashSqueeze((Keccak_HashInstance *)local_a20,local_cc0,
                       (ulong)((uint)bVar1 * (int)local_ce0 * 8) * 3);
    Keccak_HashSqueeze((Keccak_HashInstance *)local_a20,pBVar23,0x100);
    local_c88 = (view_t *)aligned_alloc(0x20,(ulong)(pp->lowmc).r * 0x60);
    puVar27 = local_cd0;
    local_c70 = (uint8_t *)aligned_alloc(8,(ulong)(uint)((int)local_cd0 * 4) * 3);
    local_c50 = local_cb0 & 0xfffc;
    if (local_c50 != 0) {
      uVar25 = 0;
      local_cc0 = (BitSequence *)(local_ca0 & 0xffffffff);
      local_b98 = (ulong)((int)local_ca0 - 1);
      local_c4c = 0xff << (local_cac & 0x1f);
      local_cd0 = local_ac0;
      local_ce0 = local_b00;
      local_a40 = vpbroadcastq_avx512vl();
      local_b90 = (ulong)(uint)((int)local_ca8 * 8);
      local_a60 = vpbroadcastq_avx512vl();
      uVar34 = (int)local_ca8 + 7;
      uVar35 = uVar34 >> 3;
      local_c78 = (ulong)puVar27 & 0xffffffff;
      local_ba8 = (ulong)(uVar34 & 0xfffffff8) * 3;
      local_ba0 = (ulong)(uVar35 << 4);
      local_c58 = (ulong)(uVar35 << 5);
      local_c30 = pBVar23 + 0x88;
      do {
        ppVar14 = local_ce8;
        uVar6 = (undefined2)uVar25;
        kdf = (kdf_shake_x4_t *)local_a20;
        lVar22 = 0;
        local_c98 = (BitSequence *)(CONCAT44(local_c98._4_4_,(int)uVar25) | 2);
        do {
          auVar18 = _local_b80;
          local_b80._8_8_ = ppVar14[1].seeds[lVar22];
          local_b80._0_8_ = ppVar14->seeds[lVar22];
          puStack_b70 = ppVar14[2].seeds[lVar22];
          auStack_b60 = auVar18._32_32_;
          puStack_b68 = ppVar14[3].seeds[lVar22];
          local_d10._0_8_ =
               CONCAT26(uVar6,CONCAT24((short)local_c98,CONCAT22(uVar6,uVar6))) | 0x3000000010000;
          kdf_init_x4_from_seed
                    (kdf,(uint8_t **)local_b80,local_cb8,(uint16_t *)local_d10,(uint16_t)lVar22,
                     lVar22 != 2,pp);
          uVar24 = local_c38;
          lVar22 = lVar22 + 1;
          kdf = kdf + 1;
        } while (lVar22 != 3);
        lVar22 = 0;
        instance_00 = (Keccak_HashInstancetimes4 *)local_a20;
        bVar19 = true;
        local_c68 = uVar25;
        do {
          bVar28 = bVar19;
          auVar18 = _local_b80;
          local_b80._8_8_ = ppVar14[1].input_shares[lVar22];
          local_b80._0_8_ = ppVar14->input_shares[lVar22];
          puStack_b70 = ppVar14[2].input_shares[lVar22];
          auStack_b60 = auVar18._32_32_;
          puStack_b68 = ppVar14[3].input_shares[lVar22];
          Keccak_HashSqueezetimes4(instance_00,(BitSequence **)local_b80,uVar24);
          lVar32 = local_ba8;
          uVar25 = local_c58;
          lVar22 = 1;
          instance_00 = local_6e8;
          bVar19 = false;
        } while (bVar28);
        lVar22 = 0;
        puVar29 = local_c70;
        do {
          auVar18 = _local_b80;
          local_b80._8_8_ = puVar29 + local_c78;
          local_b80._0_8_ = puVar29;
          puStack_b70 = puVar29 + local_ba0;
          auStack_b60 = auVar18._32_32_;
          puStack_b68 = puVar29 + lVar32;
          Keccak_HashSqueezetimes4
                    ((Keccak_HashInstancetimes4 *)(local_a20 + lVar22),(BitSequence **)local_b80,
                     local_b90);
          lVar22 = lVar22 + 0x338;
          puVar29 = puVar29 + uVar25;
        } while (lVar22 != 0x9a8);
        lVar22 = 0;
        local_d18 = local_c70;
        pBVar23 = local_c30;
        do {
          uVar25 = local_b98;
          pBVar16 = local_cc0;
          ppVar14 = local_ce8;
          bVar26 = (byte)local_c4c;
          local_ce8[lVar22].input_shares[0][local_b98] =
               local_ce8[lVar22].input_shares[0][local_b98] & bVar26;
          local_c98 = pBVar23;
          local_b88 = lVar22;
          mzd_from_char_array((mzd_local_t *)local_c20,local_ce8[lVar22].input_shares[0],
                              (size_t)local_cc0);
          pbVar31 = ppVar14[lVar22].input_shares[1] + uVar25;
          *pbVar31 = *pbVar31 & bVar26;
          mzd_from_char_array((mzd_local_t *)local_c00,ppVar14[lVar22].input_shares[1],
                              (size_t)pBVar16);
          uVar25 = local_c58;
          pvVar17 = local_c88;
          uVar4 = (pp->lowmc).n;
          if ((~DAT_001c939c & 0x20400) == 0) {
            if (uVar4 < 0x81) {
              local_be0._0_16_ =
                   vpternlogq_avx512vl(*(undefined1 (*) [16])local_c90->w64,local_c00,local_c20,0x96
                                      );
            }
            else {
              auVar12._16_16_ = auStack_bf0;
              auVar12._0_16_ = local_c00;
              auVar10._16_16_ = auStack_c10;
              auVar10._0_16_ = local_c20;
              local_be0._0_32_ =
                   vpternlogq_avx512vl(*(undefined1 (*) [32])local_c90->w64,auVar12,auVar10,0x96);
            }
          }
          else {
            local_be0._0_16_ =
                 vpternlogq_avx512vl(local_c00,local_c20,*(undefined1 (*) [16])local_c90->w64,0x96);
            if (0x80 < uVar4) {
              local_be0._16_16_ =
                   vpternlogq_avx512vl(*(undefined1 (*) [16])(local_cc8->m_key[0].w64 + 2),
                                       auStack_bf0,auStack_c10,0x96);
            }
          }
          mzd_to_char_array(local_ce8[lVar22].input_shares[2],(mzd_local_t *)local_be0,
                            (size_t)pBVar16);
          lVar22 = 0;
          puVar29 = local_d18;
          do {
            decompress_view(pvVar17,pp,puVar29,(uint)lVar22);
            views = local_c80;
            lVar22 = lVar22 + 1;
            puVar29 = puVar29 + uVar25;
          } while (lVar22 != 3);
          pamVar30 = (mzd_local_t (*) [1])local_c20;
          (*local_c28)(local_cc8->m_plaintext,local_c80,(in_out_shares_t *)pamVar30,pvVar17,
                       local_c60);
          pBVar23 = local_c98;
          pBVar16 = local_cc0;
          lVar22 = 0;
          do {
            mzd_to_char_array(*(uint8_t **)(pBVar23 + lVar22 * 8),*pamVar30,(size_t)pBVar16);
            compress_view(*(uint8_t **)(pBVar23 + lVar22 * 8 + -0x18),pp,views,(uint)lVar22);
            ppVar14 = local_ce8;
            lVar22 = lVar22 + 1;
            pamVar30 = pamVar30 + 1;
          } while (lVar22 != 3);
          pBVar23 = pBVar23 + 0x90;
          local_d18 = local_d18 + local_c78;
          lVar22 = local_b88 + 1;
        } while (lVar22 != 4);
        lVar22 = 0;
        do {
          bVar26 = pp->digest_size;
          local_d10[0] = 4;
          if (bVar26 == 0x20) {
            uVar35 = 0x540;
            uVar34 = 0x100;
          }
          else {
            uVar35 = 0x440;
            uVar34 = 0x200;
          }
          Keccak_HashInitializetimes4((Keccak_HashInstancetimes4 *)local_a20,uVar35,uVar34,0,'\x1f')
          ;
          _local_b80 = local_a60;
          Keccak_HashUpdatetimes4
                    ((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)local_b80,8);
          local_b80._8_8_ = ppVar14[1].seeds[lVar22];
          local_b80._0_8_ = ppVar14->seeds[lVar22];
          puStack_b70 = ppVar14[2].seeds[lVar22];
          puStack_b68 = ppVar14[3].seeds[lVar22];
          Keccak_HashUpdatetimes4
                    ((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)local_b80,
                     (ulong)pp->seed_size << 3);
          Keccak_HashFinaltimes4((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)0x0);
          uVar25 = (ulong)((uint)bVar26 * 8);
          local_d10._8_8_ = local_b40;
          local_d10._0_8_ = local_b80;
          puStack_d00 = local_ce0;
          puStack_cf8 = local_cd0;
          Keccak_HashSqueezetimes4
                    ((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)local_d10,uVar25);
          local_cd2 = local_cd2 & 0xff00;
          if (bVar26 == 0x20) {
            uVar35 = 0x540;
            uVar34 = 0x100;
          }
          else {
            uVar35 = 0x440;
            uVar34 = 0x200;
          }
          Keccak_HashInitializetimes4((Keccak_HashInstancetimes4 *)local_a20,uVar35,uVar34,0,'\x1f')
          ;
          _local_d10 = local_a40;
          Keccak_HashUpdatetimes4
                    ((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)local_d10,8);
          local_d10._8_8_ = local_b40;
          local_d10._0_8_ = local_b80;
          puStack_d00 = local_ce0;
          puStack_cf8 = local_cd0;
          Keccak_HashUpdatetimes4
                    ((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)local_d10,uVar25);
          local_d10._8_8_ = ppVar14[1].input_shares[lVar22];
          local_d10._0_8_ = ppVar14->input_shares[lVar22];
          puStack_d00 = ppVar14[2].input_shares[lVar22];
          puStack_cf8 = ppVar14[3].input_shares[lVar22];
          Keccak_HashUpdatetimes4
                    ((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)local_d10,
                     (ulong)pp->input_output_size << 3);
          local_d10._8_8_ = ppVar14[1].communicated_bits[lVar22];
          local_d10._0_8_ = ppVar14->communicated_bits[lVar22];
          puStack_d00 = ppVar14[2].communicated_bits[lVar22];
          puStack_cf8 = ppVar14[3].communicated_bits[lVar22];
          Keccak_HashUpdatetimes4
                    ((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)local_d10,
                     (ulong)pp->view_size << 3);
          local_d10._8_8_ = ppVar14[1].output_shares[lVar22];
          local_d10._0_8_ = ppVar14->output_shares[lVar22];
          puStack_d00 = ppVar14[2].output_shares[lVar22];
          puStack_cf8 = ppVar14[3].output_shares[lVar22];
          Keccak_HashUpdatetimes4
                    ((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)local_d10,
                     (ulong)pp->input_output_size << 3);
          Keccak_HashFinaltimes4((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)0x0);
          local_d10._8_8_ = ppVar14[1].commitments[lVar22];
          local_d10._0_8_ = ppVar14->commitments[lVar22];
          puStack_d00 = ppVar14[2].commitments[lVar22];
          puStack_cf8 = ppVar14[3].commitments[lVar22];
          Keccak_HashSqueezetimes4
                    ((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)local_d10,uVar25);
          lVar22 = lVar22 + 1;
        } while (lVar22 != 3);
        if (local_cc8->unruh == true) {
          lVar22 = 0;
          do {
            bVar26 = pp->digest_size;
            local_d10[0] = 5;
            if (bVar26 == 0x20) {
              uVar35 = 0x540;
              uVar34 = 0x100;
            }
            else {
              uVar35 = 0x440;
              uVar34 = 0x200;
            }
            Keccak_HashInitializetimes4
                      ((Keccak_HashInstancetimes4 *)local_a20,uVar35,uVar34,0,'\x1f');
            _local_b80 = local_a60;
            Keccak_HashUpdatetimes4
                      ((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)local_b80,8);
            local_b80._8_8_ = ppVar14[1].seeds[lVar22];
            local_b80._0_8_ = ppVar14->seeds[lVar22];
            puStack_b70 = ppVar14[2].seeds[lVar22];
            puStack_b68 = ppVar14[3].seeds[lVar22];
            Keccak_HashUpdatetimes4
                      ((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)local_b80,
                       (ulong)pp->seed_size << 3);
            Keccak_HashFinaltimes4((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)0x0);
            local_d10._8_8_ = local_b40;
            local_d10._0_8_ = local_b80;
            puStack_d00 = local_ce0;
            puStack_cf8 = local_cd0;
            Keccak_HashSqueezetimes4
                      ((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)local_d10,
                       (ulong)((uint)bVar26 * 8));
            if (bVar26 == 0x20) {
              uVar35 = 0x540;
              uVar34 = 0x100;
            }
            else {
              uVar35 = 0x440;
              uVar34 = 0x200;
            }
            Keccak_HashInitializetimes4
                      ((Keccak_HashInstancetimes4 *)local_a20,uVar35,uVar34,0,'\x1f');
            local_d10._8_8_ = local_b40;
            local_d10._0_8_ = local_b80;
            puStack_d00 = local_ce0;
            puStack_cf8 = local_cd0;
            Keccak_HashUpdatetimes4
                      ((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)local_d10,
                       (ulong)((uint)bVar26 * 8));
            if (lVar22 == 2) {
              local_d10._8_8_ = ppVar14[1].input_shares[2];
              local_d10._0_8_ = ppVar14->input_shares[2];
              puStack_d00 = ppVar14[2].input_shares[2];
              puStack_cf8 = ppVar14[3].input_shares[2];
              Keccak_HashUpdatetimes4
                        ((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)local_d10,
                         (ulong)pp->input_output_size << 3);
            }
            local_d10._8_8_ = ppVar14[1].communicated_bits[lVar22];
            local_d10._0_8_ = ppVar14->communicated_bits[lVar22];
            puStack_d00 = ppVar14[2].communicated_bits[lVar22];
            puStack_cf8 = ppVar14[3].communicated_bits[lVar22];
            Keccak_HashUpdatetimes4
                      ((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)local_d10,
                       (ulong)pp->view_size << 3);
            uVar34 = 0;
            if (lVar22 == 2) {
              uVar34 = (uint)pp->input_output_size;
            }
            iVar20 = (uint)pp->view_size + (uint)pp->input_output_size + uVar34;
            local_cd2 = (ushort)iVar20;
            _local_d10 = local_a40;
            Keccak_HashUpdatetimes4
                      ((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)local_d10,0x10);
            Keccak_HashFinaltimes4((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)0x0);
            local_d10._8_8_ = ppVar14[1].gs[lVar22];
            local_d10._0_8_ = ppVar14->gs[lVar22];
            puStack_d00 = ppVar14[2].gs[lVar22];
            puStack_cf8 = ppVar14[3].gs[lVar22];
            Keccak_HashSqueezetimes4
                      ((Keccak_HashInstancetimes4 *)local_a20,(BitSequence **)local_d10,
                       (ulong)(uint)(iVar20 * 8));
            lVar22 = lVar22 + 1;
          } while (lVar22 != 3);
        }
        local_c30 = local_c30 + 0x240;
        local_ce8 = ppVar14 + 4;
        uVar34 = (int)local_c68 + 4;
        uVar25 = (ulong)uVar34;
      } while (uVar34 < local_c50);
    }
    if ((uint)uVar25 < local_cb0) {
      uVar24 = (ulong)(uint)((int)local_ca0 * 8);
      local_ce0 = (undefined1 *)(ulong)((int)local_ca0 - 1);
      local_cd0 = (undefined1 *)CONCAT44(local_cd0._4_4_,0xff << (local_cac & 0x1f));
      local_ca8 = (ulong)(uint)((int)local_ca8 << 3);
      do {
        pBVar23 = local_cb8;
        ppVar14 = local_ce8;
        kdf_00 = (kdf_shake_t *)local_a20;
        lVar22 = 0;
        local_c68 = uVar25;
        do {
          kdf_init_from_seed(kdf_00,ppVar14->seeds[lVar22],pBVar23,(uint16_t)uVar25,(uint16_t)lVar22
                             ,lVar22 != 2,pp);
          lVar22 = lVar22 + 1;
          kdf_00 = kdf_00 + 1;
        } while (lVar22 != 3);
        Keccak_HashSqueeze((Keccak_HashInstance *)local_a20,ppVar14->input_shares[0],uVar24);
        uVar33 = local_ca0;
        puVar27 = local_ce0;
        bVar26 = (byte)local_cd0;
        ppVar14->input_shares[0][(long)local_ce0] =
             ppVar14->input_shares[0][(long)local_ce0] & bVar26;
        mzd_from_char_array((mzd_local_t *)local_c20,ppVar14->input_shares[0],local_ca0);
        Keccak_HashSqueeze((Keccak_HashInstance *)(local_a20 + 0xe0),ppVar14->input_shares[1],uVar24
                          );
        ppVar14->input_shares[1][(long)puVar27] = ppVar14->input_shares[1][(long)puVar27] & bVar26;
        mzd_from_char_array((mzd_local_t *)local_c00,ppVar14->input_shares[1],uVar33);
        uVar25 = local_ca8;
        uVar4 = (pp->lowmc).n;
        if ((~DAT_001c939c & 0x20400) == 0) {
          if (uVar4 < 0x81) {
            local_be0._0_16_ =
                 vpternlogq_avx512vl(*(undefined1 (*) [16])local_c90->w64,local_c00,local_c20,0x96);
          }
          else {
            auVar13._16_16_ = auStack_bf0;
            auVar13._0_16_ = local_c00;
            auVar11._16_16_ = auStack_c10;
            auVar11._0_16_ = local_c20;
            local_be0._0_32_ =
                 vpternlogq_avx512vl(*(undefined1 (*) [32])local_c90->w64,auVar13,auVar11,0x96);
          }
        }
        else {
          local_be0._0_16_ =
               vpternlogq_avx512vl(local_c00,local_c20,*(undefined1 (*) [16])local_c90->w64,0x96);
          if (0x80 < uVar4) {
            local_be0._16_16_ =
                 vpternlogq_avx512vl(*(undefined1 (*) [16])(local_cc8->m_key[0].w64 + 2),auStack_bf0
                                     ,auStack_c10,0x96);
          }
        }
        mzd_to_char_array(ppVar14->input_shares[2],(mzd_local_t *)local_be0,uVar33);
        pvVar17 = local_c88;
        instance = (Keccak_HashInstance *)local_a20;
        lVar22 = 0;
        do {
          Keccak_HashSqueeze(instance,local_b80,uVar25);
          decompress_view(pvVar17,pp,local_b80,(uint)lVar22);
          lVar22 = lVar22 + 1;
          instance = instance + 1;
        } while (lVar22 != 3);
        pamVar30 = (mzd_local_t (*) [1])local_c20;
        (*local_c28)(local_cc8->m_plaintext,local_c80,(in_out_shares_t *)pamVar30,pvVar17,local_c60)
        ;
        uVar25 = local_ca0;
        ppVar14 = local_ce8;
        lVar22 = 0;
        do {
          mzd_to_char_array(ppVar14->output_shares[lVar22],*pamVar30,uVar25);
          compress_view(ppVar14->communicated_bits[lVar22],pp,local_c80,(uint)lVar22);
          hash_commitment(pp,ppVar14,(uint)lVar22);
          lVar22 = lVar22 + 1;
          pamVar30 = pamVar30 + 1;
        } while (lVar22 != 3);
        if (local_cc8->unruh == true) {
          uVar34 = 0;
          do {
            unruh_G(pp,ppVar14,uVar34,uVar34 == 2);
            uVar34 = uVar34 + 1;
          } while (uVar34 != 3);
        }
        local_ce8 = ppVar14 + 1;
        uVar34 = (int)local_c68 + 1;
        uVar25 = (ulong)uVar34;
      } while (uVar34 != local_cb0);
    }
    uVar4 = pp->num_rounds;
    local_b80[0] = 1;
    if (pp->digest_size == ' ') {
      uVar35 = 0x540;
      uVar34 = 0x100;
    }
    else {
      uVar35 = 0x440;
      uVar34 = 0x200;
    }
    Keccak_HashInitialize((Keccak_HashInstance *)local_a20,uVar35,uVar34,0,'\x1f');
    Keccak_HashUpdate((Keccak_HashInstance *)local_a20,local_b80,8);
    pBVar23 = local_cb8;
    iVar20 = (uint)uVar4 * 0x18;
    Keccak_HashUpdate((Keccak_HashInstance *)local_a20,*(BitSequence **)(local_cb8 + 0x88),
                      (ulong)((uint)pp->input_output_size * iVar20));
    Keccak_HashUpdate((Keccak_HashInstance *)local_a20,*(BitSequence **)(pBVar23 + 0x40),
                      (ulong)((uint)pp->digest_size * iVar20));
    ppVar15 = local_cc8;
    if (local_cc8->unruh == true) {
      Keccak_HashUpdate((Keccak_HashInstance *)local_a20,*(BitSequence **)(pBVar23 + 0xa0),
                        (ulong)((uint)uVar4 *
                                ((uint)pp->view_size + (uint)pp->view_size * 2 +
                                (uint)pp->input_output_size * 4) * 8));
    }
    H3_public_key_message((hash_context *)local_a20,pp,pBVar23,ppVar15);
    Keccak_HashFinal((hash_context *)local_a20,(BitSequence *)0x0);
    _local_b80 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
    Keccak_HashSqueeze((hash_context *)local_a20,local_b80,(ulong)pp->digest_size << 3);
    H3_compute((picnic_instance_t *)(ulong)pp->num_rounds,(uint8_t *)(ulong)pp->digest_size,
               local_b80);
    uVar4 = pp->num_rounds;
    pbVar31 = *(byte **)(pBVar23 + 0x20);
    if ((ulong)uVar4 == 0) {
      uVar7 = *(undefined8 *)(pBVar23 + 8);
      uVar8 = *(undefined8 *)(pBVar23 + 0x10);
      uVar9 = *(undefined8 *)(pBVar23 + 0x18);
      puVar29 = local_c48 + 0x20;
      *(undefined8 *)local_c48 = *(undefined8 *)pBVar23;
      *(undefined8 *)(local_c48 + 8) = uVar7;
      *(undefined8 *)(local_c48 + 0x10) = uVar8;
      *(undefined8 *)(local_c48 + 0x18) = uVar9;
    }
    else {
      local_ce0 = (undefined1 *)(ulong)pp->view_size;
      local_cc0 = (BitSequence *)(ulong)pp->input_output_size;
      local_c78 = CONCAT44(local_c78._4_4_,(uint)pp->view_size + (uint)pp->input_output_size);
      local_cd0 = (undefined1 *)(ulong)pp->seed_size;
      local_ce8 = (proof_round_t *)(ulong)pp->digest_size;
      uVar25 = 0;
      do {
        uVar24 = uVar25;
        bVar26 = *pbVar31;
        uVar34 = (uint)bVar26 + (uint)bVar26 & 2 | (uint)(bVar26 >> 1);
        if ((uVar24 & 6) == 0) {
          bVar26 = (char)uVar34 << 6;
        }
        else {
          bVar26 = (byte)(uVar34 << ((byte)(6 - ((byte)uVar24 & 6)) & 0x1f)) |
                   local_c48[uVar24 >> 3];
        }
        pbVar31 = pbVar31 + 1;
        local_c48[uVar24 >> 3] = bVar26;
        uVar25 = uVar24 + 2;
      } while ((ulong)((uint)uVar4 + (uint)uVar4) != uVar24 + 2);
      uVar7 = *(undefined8 *)(pBVar23 + 8);
      uVar8 = *(undefined8 *)(pBVar23 + 0x10);
      uVar9 = *(undefined8 *)(pBVar23 + 0x18);
      puVar36 = pBVar23 + 0x68;
      uVar25 = 0;
      puVar29 = local_c48 + (uVar24 + 9 >> 3 & 0xffffffff) + 0x20;
      *(undefined8 *)(puVar29 + -0x20) = *(undefined8 *)pBVar23;
      *(undefined8 *)(puVar29 + -0x18) = uVar7;
      *(undefined8 *)(puVar29 + -0x10) = uVar8;
      *(undefined8 *)(puVar29 + -8) = uVar9;
      local_c98 = local_cc0;
      do {
        ppVar14 = local_ce8;
        bVar26 = *(byte *)(*(long *)(pBVar23 + 0x20) + uVar25);
        uVar33 = (ulong)bVar26;
        uVar24 = (ulong)(bVar26 + 2 + ((bVar26 + 2) / 3) * -3 & 0xffff);
        memcpy(puVar29,*(void **)(puVar36 + uVar24 * 8 + -0x28),(size_t)local_ce8);
        puVar29 = puVar29 + (long)ppVar14;
        if (*(void **)(puVar36 + uVar24 * 8 + 0x38) != (void *)0x0) {
          iVar20 = 0;
          if (uVar33 == 0) {
            iVar20 = (int)local_cc0;
          }
          uVar34 = iVar20 + (int)local_c78;
          memcpy(puVar29,*(void **)(puVar36 + uVar24 * 8 + 0x38),(ulong)uVar34);
          puVar29 = puVar29 + uVar34;
        }
        puVar27 = local_ce0;
        uVar24 = (ulong)(bVar26 + 1 + ((uint)bVar26 * 0x5556 + 0x5556 >> 0x10) * -3 & 0xffff);
        memcpy(puVar29,*(void **)(puVar36 + uVar24 * 8 + 8),(size_t)local_ce0);
        __n = local_cd0;
        puVar29 = puVar29 + (long)puVar27;
        memcpy(puVar29,*(void **)(puVar36 + uVar33 * 8 + -0x40),(size_t)local_cd0);
        memcpy(puVar29 + (long)__n,*(void **)(puVar36 + uVar24 * 8 + -0x40),(size_t)__n);
        pBVar23 = local_c98;
        puVar29 = puVar29 + (long)__n + (long)__n;
        if (uVar33 != 0) {
          memcpy(puVar29,*(void **)puVar36,(size_t)local_c98);
          puVar29 = puVar29 + (long)pBVar23;
        }
        puVar36 = puVar36 + 0x90;
        uVar25 = uVar25 + 1;
        pBVar23 = local_cb8;
      } while (uVar4 != uVar25);
      pbVar31 = *(byte **)(local_cb8 + 0x20);
    }
    *local_c40 = (long)puVar29 - (long)local_c48;
    free(local_c70);
    free(local_c88);
    free(local_c80);
    free(pbVar31);
    free(pBVar23);
    free(local_c60);
    iVar20 = 0;
  }
  else {
    free(state);
    iVar20 = -2;
  }
  return iVar20;
}

Assistant:

int picnic_impl_sign(const picnic_instance_t* pp, const picnic_context_t* context, uint8_t* sig,
                     size_t* siglen) {
  const unsigned int num_rounds        = pp->num_rounds;
  const unsigned int input_output_size = pp->input_output_size;
  const unsigned int view_size         = pp->view_size;
  const unsigned int aview_size        = ALIGNU64T(view_size);
  const unsigned int diff              = input_output_size * 8 - pp->lowmc.n;

  const zkbpp_lowmc_implementation_f lowmc_impl = get_zkbpp_lowmc_implementation(&pp->lowmc);

  // Perform LowMC evaluation and record state before AND gates
  recorded_state_t* recorded_state =
      picnic_aligned_alloc(32, sizeof(recorded_state_t) * (pp->lowmc.r + 1));
  lowmc_record_state(&pp->lowmc, context->m_key, context->m_plaintext, recorded_state);
  // Validate public key
  {
    uint8_t public_key[MAX_LOWMC_BLOCK_SIZE] = {0};
    mzd_to_char_array(public_key, recorded_state[pp->lowmc.r].state, pp->input_output_size);
    const int check =
        picnic_timingsafe_bcmp(context->public_key, &public_key, pp->input_output_size);
    // check encodes the consistency of the embedded public key with the secret key and is safe to
    // leak.
    picnic_declassify(&check, sizeof(check));
    if (check) {
      picnic_aligned_free(recorded_state);
      return -2;
    }
  }

  sig_proof_t* prf = proof_new(pp, context);
  view_t* views    = picnic_aligned_alloc(32, sizeof(view_t) * pp->lowmc.r);

  in_out_shares_t in_out_shares;

  // Generate seeds
  generate_seeds(pp, context, prf->round[0].seeds[0], prf->salt);

  rvec_t* rvec =
      picnic_aligned_alloc(32, sizeof(rvec_t) * pp->lowmc.r); // random tapes for AND-gates
  uint8_t* tape_bytes_x4 = picnic_aligned_alloc(sizeof(uint64_t), SC_PROOF * 4 * aview_size);

  proof_round_t* round = prf->round;
  unsigned int i       = 0;
  for (; i < (num_rounds / 4) * 4; i += 4, round += 4) {
    // use 4 parallel instances of keccak for speedup
    {
      kdf_shake_x4_t kdfs[SC_PROOF];
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        const bool include_input_size   = (j != SC_PROOF - 1);
        const uint8_t* seeds[4]         = {round[0].seeds[j], round[1].seeds[j], round[2].seeds[j],
                                           round[3].seeds[j]};
        const uint16_t round_numbers[4] = {i, i + 1, i + 2, i + 3};
        kdf_init_x4_from_seed(&kdfs[j], seeds, prf->salt, round_numbers, j, include_input_size, pp);
      }

      // compute sharing
      for (unsigned int j = 0; j < SC_PROOF - 1; ++j) {
        kdf_shake_x4_get_randomness_4(&kdfs[j], round[0].input_shares[j], round[1].input_shares[j],
                                      round[2].input_shares[j], round[3].input_shares[j],
                                      input_output_size);
      }
      // compute random tapes
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        kdf_shake_x4_get_randomness_4(&kdfs[j], &tape_bytes_x4[(j * 4 + 0) * aview_size],
                                      &tape_bytes_x4[(j * 4 + 1) * aview_size],
                                      &tape_bytes_x4[(j * 4 + 2) * aview_size],
                                      &tape_bytes_x4[(j * 4 + 3) * aview_size], view_size);
        kdf_shake_x4_clear(&kdfs[j]);
      }
    }

    for (unsigned int round_offset = 0; round_offset < 4; round_offset++) {
      for (unsigned int j = 0; j < SC_PROOF - 1; ++j) {
        clear_padding_bits(&round[round_offset].input_shares[j][input_output_size - 1], diff);
        mzd_from_char_array(in_out_shares.s[j], round[round_offset].input_shares[j],
                            input_output_size);
      }
      mzd_share(&pp->lowmc, in_out_shares.s[2], in_out_shares.s[0], in_out_shares.s[1],
                context->m_key);
      mzd_to_char_array(round[round_offset].input_shares[SC_PROOF - 1],
                        in_out_shares.s[SC_PROOF - 1], input_output_size);

      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        decompress_random_tape(rvec, pp, &tape_bytes_x4[(j * 4 + round_offset) * aview_size], j);
      }

      // perform ZKB++ LowMC evaluation
      lowmc_impl(context->m_plaintext, views, &in_out_shares, rvec, recorded_state);

      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        mzd_to_char_array(round[round_offset].output_shares[j], in_out_shares.s[j],
                          input_output_size);
        compress_view(round[round_offset].communicated_bits[j], pp, views, j);
      }
    }

    // commitments
    for (unsigned int j = 0; j < SC_PROOF; ++j) {
      hash_commitment_x4(pp, round, j);
    }

#if defined(WITH_UNRUH)
    // unruh G
    if (context->unruh) {
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        unruh_G_x4(pp, round, j, j == SC_PROOF - 1);
      }
    }
#endif
  }
  for (; i < num_rounds; ++i, ++round) {
    {
      kdf_shake_t kdfs[SC_PROOF];
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        const bool include_input_size = (j != SC_PROOF - 1);
        kdf_init_from_seed(&kdfs[j], round->seeds[j], prf->salt, i, j, include_input_size, pp);
      }

      // compute sharing
      for (unsigned int j = 0; j < SC_PROOF - 1; ++j) {
        kdf_shake_get_randomness(&kdfs[j], round->input_shares[j], input_output_size);
        clear_padding_bits(&round->input_shares[j][input_output_size - 1], diff);
        mzd_from_char_array(in_out_shares.s[j], round->input_shares[j], input_output_size);
      }
      mzd_share(&pp->lowmc, in_out_shares.s[2], in_out_shares.s[0], in_out_shares.s[1],
                context->m_key);
      mzd_to_char_array(round->input_shares[SC_PROOF - 1], in_out_shares.s[SC_PROOF - 1],
                        input_output_size);

      // compute random tapes
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        assert(view_size <= MAX_VIEW_SIZE);
        uint8_t tape_bytes[MAX_VIEW_SIZE];
        kdf_shake_get_randomness(&kdfs[j], tape_bytes, view_size);
        decompress_random_tape(rvec, pp, tape_bytes, j);
      }

      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        kdf_shake_clear(&kdfs[j]);
      }
    }

    // perform ZKB++ LowMC evaluation
    lowmc_impl(context->m_plaintext, views, &in_out_shares, rvec, recorded_state);

    // commitments
    for (unsigned int j = 0; j < SC_PROOF; ++j) {
      mzd_to_char_array(round->output_shares[j], in_out_shares.s[j], input_output_size);
      compress_view(round->communicated_bits[j], pp, views, j);
      hash_commitment(pp, round, j);
    }

#if defined(WITH_UNRUH)
    // unruh G
    if (context->unruh) {
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        unruh_G(pp, round, j, j == SC_PROOF - 1);
      }
    }
#endif
  }
  H3(pp, prf, context);

  const int ret = sig_proof_to_char_array(pp, prf, sig, siglen);

  // clean up
  picnic_aligned_free(tape_bytes_x4);
  picnic_aligned_free(rvec);
  picnic_aligned_free(views);
  proof_free(prf);
  picnic_aligned_free(recorded_state);
  return ret;
}